

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::rehash
          (Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *this,size_t sizeHint)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  undefined3 uVar5;
  bool bVar6;
  size_t sVar7;
  Node<int,_QEvdevTouchScreenData::Contact> *pNVar8;
  Node<int,_QEvdevTouchScreenData::Contact> *pNVar9;
  void *pvVar10;
  long lVar11;
  long in_RDI;
  long in_FS_OFFSET;
  R RVar12;
  Node<int,_QEvdevTouchScreenData::Contact> *newNode;
  Node<int,_QEvdevTouchScreenData::Contact> *n;
  size_t index;
  Span *span;
  size_t s;
  size_t oldNSpans;
  size_t oldBucketCount;
  Span *oldSpans;
  size_t newBucketCount;
  Bucket it;
  size_t in_stack_ffffffffffffff48;
  Span<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *in_stack_ffffffffffffff50;
  int *in_stack_ffffffffffffff58;
  Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *in_stack_ffffffffffffff60;
  long lVar13;
  size_t in_stack_ffffffffffffff90;
  ulong i;
  ulong local_60;
  Span *local_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar7 = GrowthPolicy::bucketsForCapacity(in_stack_ffffffffffffff48);
  lVar2 = *(long *)(in_RDI + 0x20);
  uVar3 = *(ulong *)(in_RDI + 0x10);
  RVar12 = allocateSpans(in_stack_ffffffffffffff90);
  local_50 = RVar12.spans;
  *(Span **)(in_RDI + 0x20) = local_50;
  *(size_t *)(in_RDI + 0x10) = sVar7;
  for (local_60 = 0; local_60 < uVar3 >> 7; local_60 = local_60 + 1) {
    for (i = 0; i < 0x80; i = i + 1) {
      bVar6 = Span<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::hasNode
                        ((Span<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *)
                         (lVar2 + local_60 * 0x90),i);
      if (bVar6) {
        pNVar8 = Span<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::at
                           (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        findBucket<int>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        pNVar9 = Bucket::insert((Bucket *)0x15b527);
        iVar4 = (pNVar8->value).trackingId;
        pNVar9->key = pNVar8->key;
        (pNVar9->value).trackingId = iVar4;
        iVar4 = (pNVar8->value).y;
        (pNVar9->value).x = (pNVar8->value).x;
        (pNVar9->value).y = iVar4;
        iVar4 = (pNVar8->value).pressure;
        (pNVar9->value).maj = (pNVar8->value).maj;
        (pNVar9->value).pressure = iVar4;
        uVar5 = *(undefined3 *)&(pNVar8->value).field_0x15;
        (pNVar9->value).state = (pNVar8->value).state;
        *(undefined3 *)&(pNVar9->value).field_0x15 = uVar5;
      }
    }
    Span<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::freeData
              (in_stack_ffffffffffffff50);
  }
  if (lVar2 != 0) {
    pvVar10 = (void *)(lVar2 + -8);
    lVar13 = *(long *)(lVar2 + -8);
    lVar11 = lVar2 + lVar13 * 0x90;
    while (lVar2 != lVar11) {
      lVar11 = lVar11 + -0x90;
      Span<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::~Span
                ((Span<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *)0x15b5dc);
    }
    operator_delete__(pvVar10,lVar13 * 0x90 + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }